

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O1

void Inta_ManResize(Inta_Man_t *p)

{
  int iVar1;
  lit *plVar2;
  char *pcVar3;
  int *piVar4;
  Sto_Cls_t **ppSVar5;
  Aig_Obj_t **ppAVar6;
  int iVar7;
  size_t sVar8;
  
  p->Counter = 0;
  iVar1 = p->pCnf->nVars;
  if (p->nVarsAlloc < iVar1) {
    if (p->nVarsAlloc == 0) {
      p->nVarsAlloc = 1;
    }
    iVar7 = p->nVarsAlloc;
    if (iVar7 < iVar1) {
      do {
        iVar7 = iVar7 * 2;
      } while (iVar7 < iVar1);
      p->nVarsAlloc = iVar7;
    }
    if (p->pTrail == (lit *)0x0) {
      plVar2 = (lit *)malloc((long)iVar7 << 2);
    }
    else {
      plVar2 = (lit *)realloc(p->pTrail,(long)iVar7 << 2);
    }
    p->pTrail = plVar2;
    sVar8 = (long)p->nVarsAlloc << 2;
    if (p->pAssigns == (lit *)0x0) {
      plVar2 = (lit *)malloc(sVar8);
    }
    else {
      plVar2 = (lit *)realloc(p->pAssigns,sVar8);
    }
    p->pAssigns = plVar2;
    if (p->pSeens == (char *)0x0) {
      pcVar3 = (char *)malloc((long)p->nVarsAlloc);
    }
    else {
      pcVar3 = (char *)realloc(p->pSeens,(long)p->nVarsAlloc);
    }
    p->pSeens = pcVar3;
    sVar8 = (long)p->nVarsAlloc << 2;
    if (p->pVarTypes == (int *)0x0) {
      piVar4 = (int *)malloc(sVar8);
    }
    else {
      piVar4 = (int *)realloc(p->pVarTypes,sVar8);
    }
    p->pVarTypes = piVar4;
    sVar8 = (long)p->nVarsAlloc << 3;
    if (p->pReasons == (Sto_Cls_t **)0x0) {
      ppSVar5 = (Sto_Cls_t **)malloc(sVar8);
    }
    else {
      ppSVar5 = (Sto_Cls_t **)realloc(p->pReasons,sVar8);
    }
    p->pReasons = ppSVar5;
    sVar8 = (long)p->nVarsAlloc << 4;
    if (p->pWatches == (Sto_Cls_t **)0x0) {
      ppSVar5 = (Sto_Cls_t **)malloc(sVar8);
    }
    else {
      ppSVar5 = (Sto_Cls_t **)realloc(p->pWatches,sVar8);
    }
    p->pWatches = ppSVar5;
  }
  memset(p->pAssigns,0xff,(long)p->pCnf->nVars << 2);
  memset(p->pSeens,0,(long)p->pCnf->nVars);
  memset(p->pVarTypes,0,(long)p->pCnf->nVars << 2);
  memset(p->pReasons,0,(long)p->pCnf->nVars << 3);
  memset(p->pWatches,0,(long)p->pCnf->nVars << 4);
  Inta_ManGlobalVars(p);
  iVar1 = p->pCnf->nClauses;
  if (p->nClosAlloc < iVar1) {
    if (p->nClosAlloc == 0) {
      p->nClosAlloc = 1;
    }
    iVar7 = p->nClosAlloc;
    if (iVar7 < iVar1) {
      do {
        iVar7 = iVar7 * 2;
      } while (iVar7 < iVar1);
      p->nClosAlloc = iVar7;
    }
    if (p->pProofNums == (int *)0x0) {
      piVar4 = (int *)malloc((long)iVar7 << 2);
    }
    else {
      piVar4 = (int *)realloc(p->pProofNums,(long)iVar7 << 2);
    }
    p->pProofNums = piVar4;
  }
  memset(p->pProofNums,0,(long)p->pCnf->nClauses << 2);
  iVar1 = p->pCnf->nClauses;
  if (p->nIntersAlloc < iVar1) {
    p->nIntersAlloc = iVar1;
    if (p->pInters == (Aig_Obj_t **)0x0) {
      ppAVar6 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
    }
    else {
      ppAVar6 = (Aig_Obj_t **)realloc(p->pInters,(long)iVar1 << 3);
    }
    p->pInters = ppAVar6;
  }
  memset(p->pInters,0,(long)p->pCnf->nClauses << 3);
  return;
}

Assistant:

void Inta_ManResize( Inta_Man_t * p )
{
    p->Counter = 0;
    // check if resizing is needed
    if ( p->nVarsAlloc < p->pCnf->nVars )
    {
        // find the new size
        if ( p->nVarsAlloc == 0 )
            p->nVarsAlloc = 1;
        while ( p->nVarsAlloc < p->pCnf->nVars ) 
            p->nVarsAlloc *= 2;
        // resize the arrays
        p->pTrail    = ABC_REALLOC(lit,         p->pTrail,    p->nVarsAlloc );
        p->pAssigns  = ABC_REALLOC(lit,         p->pAssigns,  p->nVarsAlloc );
        p->pSeens    = ABC_REALLOC(char,        p->pSeens,    p->nVarsAlloc );
        p->pVarTypes = ABC_REALLOC(int,         p->pVarTypes, p->nVarsAlloc );
        p->pReasons  = ABC_REALLOC(Sto_Cls_t *, p->pReasons,  p->nVarsAlloc );
        p->pWatches  = ABC_REALLOC(Sto_Cls_t *, p->pWatches,  p->nVarsAlloc*2 );
    }

    // clean the free space
    memset( p->pAssigns , 0xff, sizeof(lit) * p->pCnf->nVars );
    memset( p->pSeens   , 0,    sizeof(char) * p->pCnf->nVars );
    memset( p->pVarTypes, 0,    sizeof(int) * p->pCnf->nVars );
    memset( p->pReasons , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars );
    memset( p->pWatches , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars*2 );

    // compute the number of common variables
    Inta_ManGlobalVars( p );

    // check if resizing of clauses is needed
    if ( p->nClosAlloc < p->pCnf->nClauses )
    {
        // find the new size
        if ( p->nClosAlloc == 0 )
            p->nClosAlloc = 1;
        while ( p->nClosAlloc < p->pCnf->nClauses ) 
            p->nClosAlloc *= 2;
        // resize the arrays
        p->pProofNums = ABC_REALLOC( int, p->pProofNums,  p->nClosAlloc );
    }
    memset( p->pProofNums, 0, sizeof(int) * p->pCnf->nClauses );

    // check if resizing of truth tables is needed
    if ( p->nIntersAlloc < p->pCnf->nClauses )
    {
        p->nIntersAlloc = p->pCnf->nClauses;
        p->pInters = ABC_REALLOC( Aig_Obj_t *, p->pInters, p->nIntersAlloc );
    }
    memset( p->pInters, 0, sizeof(Aig_Obj_t *) * p->pCnf->nClauses );
}